

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3Dequote(char *z)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  
  bVar1 = *z;
  if ((bVar1 - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0)) {
    bVar2 = 0x5d;
    if (bVar1 != 0x5b) {
      bVar2 = bVar1;
    }
    iVar4 = 1;
    uVar3 = 0;
    while( true ) {
      bVar1 = z[iVar4];
      if (bVar1 == 0) break;
      if (bVar1 == bVar2) {
        if (z[(long)iVar4 + 1] != bVar2) break;
        z[uVar3] = bVar2;
        iVar4 = iVar4 + 2;
      }
      else {
        iVar4 = iVar4 + 1;
        z[uVar3] = bVar1;
      }
      uVar3 = uVar3 + 1;
    }
    z[uVar3 & 0xffffffff] = '\0';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3Dequote(char *z){
  char quote;                     /* Quote character (if any ) */

  quote = z[0];
  if( quote=='[' || quote=='\'' || quote=='"' || quote=='`' ){
    int iIn = 1;                  /* Index of next byte to read from input */
    int iOut = 0;                 /* Index of next byte to write to output */

    /* If the first byte was a '[', then the close-quote character is a ']' */
    if( quote=='[' ) quote = ']';  

    while( z[iIn] ){
      if( z[iIn]==quote ){
        if( z[iIn+1]!=quote ) break;
        z[iOut++] = quote;
        iIn += 2;
      }else{
        z[iOut++] = z[iIn++];
      }
    }
    z[iOut] = '\0';
  }
}